

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glTFImporter.cpp
# Opt level: O0

void __thiscall Assimp::glTFImporter::ImportEmbeddedTextures(glTFImporter *this,Asset *r)

{
  undefined1 auVar1 [16];
  bool bVar2;
  uint uVar3;
  int iVar4;
  Image *pIVar5;
  ulong uVar6;
  aiTexture **ppaVar7;
  uint *puVar8;
  aiTexture *this_00;
  size_t sVar9;
  aiTexel *paVar10;
  char *pcVar11;
  size_t sVar12;
  size_t len;
  char *ext;
  void *data;
  size_t length;
  aiTexture *tex;
  int idx;
  Image *img;
  size_t i_1;
  size_t i;
  int numEmbeddedTexs;
  Asset *r_local;
  glTFImporter *this_local;
  
  _numEmbeddedTexs = r;
  r_local = (Asset *)this;
  uVar3 = glTF::LazyDict<glTF::Image>::Size(&r->images);
  i._4_4_ = 0xffffffff;
  std::vector<int,_std::allocator<int>_>::resize
            (&this->embeddedTexIdxs,(ulong)uVar3,(value_type_conflict3 *)((long)&i + 4));
  i._0_4_ = 0;
  for (i_1 = 0; uVar3 = glTF::LazyDict<glTF::Image>::Size(&_numEmbeddedTexs->images), i_1 < uVar3;
      i_1 = i_1 + 1) {
    pIVar5 = glTF::LazyDict<glTF::Image>::operator[](&_numEmbeddedTexs->images,i_1);
    bVar2 = glTF::Image::HasData(pIVar5);
    if (bVar2) {
      i._0_4_ = (int)i + 1;
    }
  }
  if ((int)i != 0) {
    auVar1._8_8_ = 0;
    auVar1._0_8_ = (long)(int)i;
    uVar6 = SUB168(auVar1 * ZEXT816(8),0);
    if (SUB168(auVar1 * ZEXT816(8),8) != 0) {
      uVar6 = 0xffffffffffffffff;
    }
    ppaVar7 = (aiTexture **)operator_new__(uVar6);
    this->mScene->mTextures = ppaVar7;
    for (img = (Image *)0x0; uVar3 = glTF::LazyDict<glTF::Image>::Size(&_numEmbeddedTexs->images),
        img < (Image *)(ulong)uVar3; img = (Image *)((long)&(img->super_Object)._vptr_Object + 1)) {
      pIVar5 = glTF::LazyDict<glTF::Image>::operator[](&_numEmbeddedTexs->images,(size_t)img);
      bVar2 = glTF::Image::HasData(pIVar5);
      if (bVar2) {
        uVar3 = this->mScene->mNumTextures;
        this->mScene->mNumTextures = uVar3 + 1;
        puVar8 = (uint *)std::vector<int,_std::allocator<int>_>::operator[]
                                   (&this->embeddedTexIdxs,(size_type)img);
        *puVar8 = uVar3;
        this_00 = (aiTexture *)operator_new(0x428);
        aiTexture::aiTexture(this_00);
        this->mScene->mTextures[(int)uVar3] = this_00;
        sVar9 = glTF::Image::GetDataLength(pIVar5);
        paVar10 = (aiTexel *)glTF::Image::StealData(pIVar5);
        this_00->mWidth = (uint)sVar9;
        this_00->mHeight = 0;
        this_00->pcData = paVar10;
        uVar6 = std::__cxx11::string::empty();
        if ((uVar6 & 1) == 0) {
          pcVar11 = (char *)std::__cxx11::string::c_str();
          pcVar11 = strchr(pcVar11,0x2f);
          len = (size_t)(pcVar11 + 1);
          if ((char *)len != (char *)0x0) {
            iVar4 = strcmp((char *)len,"jpeg");
            if (iVar4 == 0) {
              len = (long)".jpg" + 1;
            }
            sVar12 = strlen((char *)len);
            if (sVar12 < 4) {
              strcpy(this_00->achFormatHint,(char *)len);
            }
          }
        }
      }
    }
  }
  return;
}

Assistant:

void glTFImporter::ImportEmbeddedTextures(glTF::Asset& r)
{
    embeddedTexIdxs.resize(r.images.Size(), -1);

    int numEmbeddedTexs = 0;
    for (size_t i = 0; i < r.images.Size(); ++i) {
        if (r.images[i].HasData())
            numEmbeddedTexs += 1;
    }

    if (numEmbeddedTexs == 0)
        return;

    mScene->mTextures = new aiTexture*[numEmbeddedTexs];

    // Add the embedded textures
    for (size_t i = 0; i < r.images.Size(); ++i) {
        Image &img = r.images[i];
        if (!img.HasData()) continue;

        int idx = mScene->mNumTextures++;
        embeddedTexIdxs[i] = idx;

        aiTexture* tex = mScene->mTextures[idx] = new aiTexture();

        size_t length = img.GetDataLength();
        void* data = img.StealData();

        tex->mWidth = static_cast<unsigned int>(length);
        tex->mHeight = 0;
        tex->pcData = reinterpret_cast<aiTexel*>(data);

        if (!img.mimeType.empty()) {
            const char* ext = strchr(img.mimeType.c_str(), '/') + 1;
            if (ext) {
                if (strcmp(ext, "jpeg") == 0) ext = "jpg";

                size_t len = strlen(ext);
                if (len <= 3) {
                    strcpy(tex->achFormatHint, ext);
                }
            }
        }
    }
}